

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::Binder::PlanSubquery
          (Binder *this,BoundSubqueryExpression *expr,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root)

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  LogicalType *other;
  vector<duckdb::LogicalType,_true> *pvVar1;
  char cVar2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var4;
  ulong uVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  __node_base _Var7;
  ColumnBinding binding;
  ColumnBinding binding_00;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *puVar8;
  undefined1 auVar9 [8];
  bool bVar10;
  Binder *pBVar11;
  type pLVar12;
  pointer pLVar13;
  type pLVar14;
  pointer pLVar15;
  reference pvVar16;
  ClientContext *pCVar17;
  reference pvVar18;
  reference pvVar19;
  BoundColumnRefExpression *pBVar20;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> this_01;
  pointer this_02;
  ClientConfig *pCVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *aggregate_index;
  pointer pEVar22;
  element_type *peVar23;
  BoundConstantExpression *this_03;
  pointer pBVar24;
  pointer pBVar25;
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> _Var26;
  pointer pBVar27;
  idx_t iVar28;
  idx_t group_index;
  pointer pLVar29;
  BoundComparisonExpression *this_04;
  pointer table_index;
  unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> this_05;
  pointer pLVar30;
  NotImplementedException *this_06;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RCX;
  long lVar31;
  undefined8 uVar32;
  undefined8 *puVar33;
  undefined8 *puVar34;
  undefined8 uVar35;
  pointer *__ptr;
  vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns;
  size_type sVar36;
  byte bVar37;
  ColumnBinding binding_01;
  ColumnBinding binding_02;
  ColumnBinding binding_03;
  ColumnBinding binding_04;
  LogicalType idx_type;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  error_children;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  aggregate_list;
  vector<duckdb::ColumnBinding,_true> bindings;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projection_list;
  FunctionBinder function_binder;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  proj_expressions;
  FunctionBinder function_binder_1;
  vector<duckdb::ColumnBinding,_true> plan_columns;
  shared_ptr<duckdb::Binder,_true> sub_binder;
  FlattenDependentJoins flatten;
  vector<duckdb::ColumnBinding,_true> plan_columns_3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_5b0;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_5a8
  ;
  Binder *local_5a0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_598;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_590;
  LogicalType local_588;
  undefined1 local_568 [8];
  pointer puStack_560;
  _Alloc_hider local_558;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_550
  ;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  optional_idx local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  __uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
  local_518;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_508;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_500;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_4f8;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_4f0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_4e8;
  undefined1 local_4e0 [8];
  undefined1 local_4d8 [8];
  ClientContext *pCStack_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8 [3];
  undefined1 local_498 [32];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_478;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_458;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_438;
  undefined1 local_420 [24];
  Binder *local_408;
  undefined1 local_400 [8];
  undefined1 local_3f8 [32];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [288];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [80];
  undefined1 local_238 [56];
  undefined1 local_200 [24];
  undefined8 auStack_1e8 [5];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1c0 [88];
  undefined1 local_168 [16];
  undefined1 local_158 [160];
  undefined8 auStack_b8 [17];
  
  bVar37 = 0;
  local_5a8 = root;
  local_5a0 = (Binder *)expr;
  local_550 = in_RCX;
  CreateBinder((Binder *)local_2a8,
               (ClientContext *)(expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p
               ,(optional_ptr<duckdb::Binder,_true>)expr,REGULAR_BINDER);
  pBVar11 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_2a8);
  pBVar11->is_outside_flattened = false;
  pBVar11 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_2a8);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(local_5a8 + 0xd));
  CreatePlan((Binder *)local_420,(BoundQueryNode *)pBVar11);
  uVar32 = local_420._0_8_;
  local_420._0_8_ = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  this_00 = (shared_ptr<duckdb::Binder,_true> *)(local_5a8 + 0xb);
  pBVar11 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  if ((pBVar11->correlated_columns).
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pBVar11->correlated_columns).
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_5b0._M_head_impl = (LogicalOperator *)uVar32;
    cVar2 = *(char *)&local_5a8[0xe].
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    if (cVar2 == '\x01') {
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_5b0);
      (*pLVar13->_vptr_LogicalOperator[2])(&local_528);
      pvVar16 = vector<duckdb::ColumnBinding,_true>::operator[]
                          ((vector<duckdb::ColumnBinding,_true> *)&local_528,0);
      uVar5 = pvVar16->table_index;
      pCVar21 = ClientConfig::GetConfig
                          ((ClientContext *)(((string *)&local_5a0->context)->_M_dataplus)._M_p);
      bVar10 = pCVar21->scalar_subquery_error_on_multiple_rows;
      local_588._0_8_ = (ClientContext *)0x0;
      local_588.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_588.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pCVar17 = (ClientContext *)operator_new(0x70);
      other = (LogicalType *)(local_5a8 + 7);
      LogicalType::LogicalType((LogicalType *)local_298,other);
      binding_01.column_index = 0;
      binding_01.table_index = uVar5;
      BoundColumnRefExpression::BoundColumnRefExpression
                ((BoundColumnRefExpression *)pCVar17,(LogicalType *)local_298,binding_01,0);
      LogicalType::~LogicalType((LogicalType *)local_298);
      local_548._M_allocated_capacity = 0;
      local_548._8_8_ = 0;
      local_538.index = 0;
      local_298._0_8_ = pCVar17;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)local_548._M_local_buf,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_298);
      if ((ClientContext *)local_298._0_8_ != (ClientContext *)0x0) {
        (**(code **)(*(long *)local_298._0_8_ + 8))();
      }
      FunctionBinder::FunctionBinder((FunctionBinder *)local_3f8,local_5a0);
      FirstFunctionGetter::GetFunction((AggregateFunction *)local_298,other);
      local_498._0_8_ = local_548._M_allocated_capacity;
      local_498._8_8_ = local_548._8_8_;
      local_498._16_8_ = local_538.index;
      local_548._M_allocated_capacity = 0;
      local_548._8_8_ = 0;
      local_538.index = 0;
      local_4e8._M_head_impl = (LogicalOperator *)0x0;
      FunctionBinder::BindAggregateFunction
                ((FunctionBinder *)local_4e0,(AggregateFunction *)local_3f8,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_298,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_498,(AggregateType)&local_4e8);
      if (local_4e8._M_head_impl != (LogicalOperator *)0x0) {
        (*(local_4e8._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      local_4e8._M_head_impl = (LogicalOperator *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_498);
      local_298._0_8_ = &PTR__AggregateFunction_02433f70;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._80_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._80_8_);
      }
      BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_298);
      local_168._0_8_ = local_4e0;
      local_4e0 = (undefined1  [8])0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_588,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_168);
      if ((ClientContext *)local_168._0_8_ != (ClientContext *)0x0) {
        (*((BaseExpression *)local_168._0_8_)->_vptr_BaseExpression[1])();
      }
      if (bVar10 != false) {
        local_3d8._0_8_ = (pointer)0x0;
        local_3d8._8_8_ = (pointer)0x0;
        local_3c8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        CountStarFun::GetFunction();
        local_438.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3d8._0_8_;
        local_438.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3d8._8_8_;
        local_438.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3c8._0_8_;
        local_3d8._0_8_ = (ClientContext *)0x0;
        local_3d8._8_8_ = (pointer)0x0;
        local_3c8._0_8_ = (Binder *)0x0;
        local_4f0._M_head_impl = (LogicalProjection *)0x0;
        FunctionBinder::BindAggregateFunction
                  ((FunctionBinder *)local_4d8,(AggregateFunction *)local_3f8,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_168,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_438,(AggregateType)&local_4f0);
        if ((_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
            local_4f0._M_head_impl != (BoundCastData *)0x0) {
          (*((local_4f0._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
        }
        local_4f0._M_head_impl = (LogicalProjection *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector(&local_438);
        local_168._0_8_ = &PTR__AggregateFunction_02433f70;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_b8[0xf] !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_b8[0xf]);
        }
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_168);
        local_568 = local_4d8;
        local_4d8 = (undefined1  [8])0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_588,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_568);
        if (local_568 != (undefined1  [8])0x0) {
          (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_568)->_M_allocated_capacity + 8))();
        }
        if (local_4d8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_4d8 + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_3d8);
      }
      pBVar11 = local_5a0;
      aggregate_index =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)GenerateTableIndex(local_5a0);
      iVar28 = GenerateTableIndex(pBVar11);
      pCVar17 = (ClientContext *)operator_new(0xe0);
      local_3d8[0] = local_588.id_;
      local_3d8[1] = local_588.physical_type_;
      local_3d8._2_6_ = local_588._2_6_;
      local_3d8._8_8_ =
           local_588.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_3c8._0_8_ =
           local_588.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_588._0_8_ = (ClientContext *)0x0;
      local_588.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_588.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      LogicalAggregate::LogicalAggregate
                ((LogicalAggregate *)pCVar17,iVar28,(idx_t)aggregate_index,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_3d8);
      local_4f8._M_head_impl = (LogicalOperator *)pCVar17;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_3d8);
      pLVar29 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                              *)&local_4f8);
      local_500._M_head_impl = local_5b0._M_head_impl;
      local_5b0._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                (&pLVar29->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_500);
      if ((element_type *)local_500._M_head_impl != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                     &(local_500._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      _Var4._M_head_impl = local_4f8._M_head_impl;
      _Var3._M_head_impl = local_5b0._M_head_impl;
      local_500._M_head_impl = (LogicalOperator *)0x0;
      local_4f8._M_head_impl = (LogicalOperator *)0x0;
      local_5b0._M_head_impl = _Var4._M_head_impl;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      local_498._24_8_ = aggregate_index;
      if (bVar10 != false) {
        local_498._24_8_ = GenerateTableIndex(local_5a0);
        pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                *)&local_5b0);
        pvVar18 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](&pLVar13->expressions,0);
        pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar18);
        pBVar20 = (BoundColumnRefExpression *)operator_new(0x70);
        LogicalType::LogicalType((LogicalType *)local_3d8,&pEVar22->return_type);
        binding_02.column_index = 0;
        binding_02.table_index = (idx_t)aggregate_index;
        BoundColumnRefExpression::BoundColumnRefExpression
                  (pBVar20,(LogicalType *)local_3d8,binding_02,0);
        local_598._M_head_impl = (LogicalOperator *)pBVar20;
        LogicalType::~LogicalType((LogicalType *)local_3d8);
        pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                *)&local_5b0);
        pvVar18 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](&pLVar13->expressions,1);
        pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar18);
        pBVar20 = (BoundColumnRefExpression *)operator_new(0x70);
        LogicalType::LogicalType((LogicalType *)local_3d8,&pEVar22->return_type);
        binding_03.column_index = 1;
        binding_03.table_index = (idx_t)aggregate_index;
        BoundColumnRefExpression::BoundColumnRefExpression
                  (pBVar20,(LogicalType *)local_3d8,binding_03,0);
        LogicalType::~LogicalType((LogicalType *)local_3d8);
        Value::BIGINT((Value *)local_4d8,1);
        pBVar11 = (Binder *)operator_new(0x98);
        Value::Value((Value *)local_3d8,(Value *)local_4d8);
        BoundConstantExpression::BoundConstantExpression
                  ((BoundConstantExpression *)pBVar11,(Value *)local_3d8);
        Value::~Value((Value *)local_3d8);
        Value::~Value((Value *)local_4d8);
        peVar23 = (element_type *)operator_new(0x68);
        local_4d8 = (undefined1  [8])pBVar11;
        local_3d8._0_8_ = pBVar20;
        BoundComparisonExpression::BoundComparisonExpression
                  ((BoundComparisonExpression *)peVar23,COMPARE_GREATERTHAN,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_3d8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_4d8);
        local_508._M_head_impl = (LogicalOperator *)peVar23;
        if (local_4d8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_4d8 + 8))();
        }
        local_4d8 = (undefined1  [8])0x0;
        if ((BoundColumnRefExpression *)local_3d8._0_8_ != (BoundColumnRefExpression *)0x0) {
          (**(code **)(*(long *)local_3d8._0_8_ + 8))();
        }
        local_568 = (undefined1  [8])0x0;
        puStack_560 = (pointer)0x0;
        local_558._M_p = (pointer)0x0;
        Value::Value((Value *)local_4d8,
                     "More than one row returned by a subquery used as an expression - scalar subqueries can only return a single row.\n\nUse \"SET scalar_subquery_error_on_multiple_rows=false\" to revert to previous behavior of returning a random row."
                    );
        this_03 = (BoundConstantExpression *)operator_new(0x98);
        Value::Value((Value *)local_3d8,(Value *)local_4d8);
        BoundConstantExpression::BoundConstantExpression(this_03,(Value *)local_3d8);
        Value::~Value((Value *)local_3d8);
        local_478.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this_03;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)local_568,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_478);
        if ((BoundConstantExpression *)
            local_478.
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (BoundConstantExpression *)0x0) {
          (**(code **)(*(long *)local_478.
                                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 8))();
        }
        local_478.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        Value::~Value((Value *)local_4d8);
        ErrorFun::GetFunction();
        local_478.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_568;
        local_478.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puStack_560;
        local_478.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_558._M_p;
        local_568 = (undefined1  [8])0x0;
        puStack_560 = (pointer)0x0;
        local_558._M_p = (pointer)0x0;
        FunctionBinder::BindScalarFunction
                  ((FunctionBinder *)local_400,(ScalarFunction *)local_3f8,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_3d8,SUB81(&local_478,0),(optional_ptr<duckdb::Binder,_true>)0x0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector(&local_478);
        local_3d8._0_8_ = &PTR__ScalarFunction_02433f30;
        if ((pointer)local_3c8._272_8_ != (pointer)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._272_8_);
        }
        if ((__node_base_ptr)local_3c8._176_8_ != (__node_base_ptr)0x0) {
          (*(code *)local_3c8._176_8_)(local_3c8 + 0xa0,local_3c8 + 0xa0,3);
        }
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3d8);
        pBVar24 = unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                                *)&local_598);
        pBVar25 = (pointer)unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                         *)local_400);
        if (pBVar25 != pBVar24) {
          (pBVar25->super_Expression).return_type.id_ = (pBVar24->super_Expression).return_type.id_;
          (pBVar25->super_Expression).return_type.physical_type_ =
               (pBVar24->super_Expression).return_type.physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(pBVar25->super_Expression).return_type.type_info_,
                     &(pBVar24->super_Expression).return_type.type_info_);
        }
        make_uniq<duckdb::BoundCaseExpression,duckdb::unique_ptr<duckdb::BoundComparisonExpression,std::default_delete<duckdb::BoundComparisonExpression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>>
                  ((duckdb *)&local_408,
                   (unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                    *)&local_508,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_400,
                   (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                    *)&local_598);
        local_4d8 = (undefined1  [8])local_408;
        local_458.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_458.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_458.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_408 = (Binder *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_458,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_4d8);
        if (local_4d8 != (undefined1  [8])0x0) {
          (*(code *)(*(__node_base_ptr *)local_4d8)[1]._M_nxt)();
        }
        pCVar17 = (ClientContext *)operator_new(0x70);
        local_4d8 = (undefined1  [8])
                    local_458.
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        pCStack_4d0 = (ClientContext *)
                      local_458.
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        local_4c8[0]._M_allocated_capacity =
             local_458.
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_458.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_458.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_458.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        LogicalProjection::LogicalProjection
                  ((LogicalProjection *)pCVar17,local_498._24_8_,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_4d8);
        local_420._16_8_ = pCVar17;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_4d8);
        pLVar30 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                *)(local_420 + 0x10));
        local_420._8_8_ = local_5b0._M_head_impl;
        local_5b0._M_head_impl = (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  (&pLVar30->super_LogicalOperator,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)(local_420 + 8));
        if ((LogicalAggregate *)local_420._8_8_ != (LogicalAggregate *)0x0) {
          (*((LogicalOperator *)local_420._8_8_)->_vptr_LogicalOperator[1])();
        }
        uVar32 = local_420._16_8_;
        _Var3._M_head_impl = local_5b0._M_head_impl;
        local_420._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_420._16_8_ = (ClientContext *)0x0;
        local_5b0._M_head_impl = (LogicalOperator *)uVar32;
        if ((_Var3._M_head_impl != (LogicalOperator *)0x0) &&
           ((*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])(),
           (ClientContext *)local_420._16_8_ != (ClientContext *)0x0)) {
          (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_420._16_8_)->
                      __weak_this_).internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector(&local_458);
        if (local_408 != (Binder *)0x0) {
          (*(code *)(((local_408->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                      internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        if (local_400 != (undefined1  [8])0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_400)->__weak_this_).
                      internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_568);
        if ((element_type *)local_508._M_head_impl != (element_type *)0x0) {
          (*(((Expression *)&(local_508._M_head_impl)->_vptr_LogicalOperator)->super_BaseExpression)
            ._vptr_BaseExpression[1])();
        }
        if ((BoundColumnRefExpression *)local_598._M_head_impl != (BoundColumnRefExpression *)0x0) {
          (*(((Expression *)&(local_598._M_head_impl)->_vptr_LogicalOperator)->super_BaseExpression)
            ._vptr_BaseExpression[1])();
        }
      }
      puVar8 = local_550;
      local_458.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(local_550->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_550->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      local_598._M_head_impl = local_5b0._M_head_impl;
      local_5b0._M_head_impl = (LogicalOperator *)0x0;
      LogicalCrossProduct::Create
                ((LogicalCrossProduct *)local_4d8,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_458,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_598);
      auVar9 = local_4d8;
      local_4d8 = (undefined1  [8])0x0;
      _Var3._M_head_impl =
           (puVar8->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (puVar8->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)auVar9;
      if ((_Var3._M_head_impl != (LogicalOperator *)0x0) &&
         ((**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))(),
         local_4d8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_4d8 + 8))();
      }
      local_4d8 = (undefined1  [8])0x0;
      if ((ClientContext *)local_598._M_head_impl != (ClientContext *)0x0) {
        (*((LogicalOperator *)&(local_598._M_head_impl)->_vptr_LogicalOperator)->
          _vptr_LogicalOperator[1])();
      }
      local_598._M_head_impl = (LogicalOperator *)0x0;
      if ((Binder *)
          local_458.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (Binder *)0x0) {
        (**(code **)(*(long *)local_458.
                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_458.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (*(code *)(((local_5a8->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_4d8);
      local_568 = (undefined1  [8])local_498._24_8_;
      puStack_560 = (pointer)0x0;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)&local_508,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8,
                 other,(ColumnBinding *)local_568);
      uVar32 = local_508._M_head_impl;
      local_508._M_head_impl = (LogicalOperator *)0x0;
      if (local_4d8 != (undefined1  [8])local_4c8) {
        operator_delete((void *)local_4d8);
      }
      if (local_4f8._M_head_impl != (LogicalOperator *)0x0) {
        (*(local_4f8._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      if (local_4e0 != (undefined1  [8])0x0) {
        (*((BaseExpression *)local_4e0)->_vptr_BaseExpression[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_548);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_588);
      uVar35 = local_528._M_allocated_capacity;
LAB_00d9ad62:
      if ((ClientContext *)uVar35 != (ClientContext *)0x0) {
        operator_delete((void *)uVar35);
      }
    }
    else {
      if (cVar2 != '\x02') {
        pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                *)&local_5b0);
        (*pLVar13->_vptr_LogicalOperator[2])(local_168,pLVar13);
        pCVar17 = (ClientContext *)GenerateTableIndex(local_5a0);
        pBVar11 = (Binder *)operator_new(0x118);
        LogicalComparisonJoin::LogicalComparisonJoin
                  ((LogicalComparisonJoin *)pBVar11,MARK,LOGICAL_COMPARISON_JOIN);
        local_4d8 = (undefined1  [8])pBVar11;
        pLVar15 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)local_4d8);
        (pLVar15->super_LogicalJoin).mark_index = (idx_t)pCVar17;
        pLVar15 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)local_4d8);
        local_528._M_allocated_capacity =
             (size_type)
             (local_550->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (local_550->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  ((LogicalOperator *)pLVar15,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_528._M_allocated_capacity);
        if ((LogicalOperator *)local_528._M_allocated_capacity != (LogicalOperator *)0x0) {
          (**(code **)(*(long *)local_528._M_allocated_capacity + 8))();
        }
        local_528._M_allocated_capacity = 0;
        pLVar15 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)local_4d8);
        local_588._0_8_ = local_5b0._M_head_impl;
        local_5b0._M_head_impl = (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  ((LogicalOperator *)pLVar15,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_588);
        local_3f8._16_8_ = pCVar17;
        if ((element_type *)local_588._0_8_ != (element_type *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_588._0_8_)->__weak_this_).
                      internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        local_588._0_8_ = (ClientContext *)0x0;
        if (local_5a8[0x10].
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
            local_5a8[0xf].
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) {
          local_498._24_8_ = local_5a8 + 0xf;
          local_3f8._24_8_ = local_5a8 + 0x13;
          pvVar1 = (vector<duckdb::LogicalType,_true> *)(local_5a8 + 0x16);
          sVar36 = 0;
          do {
            local_3d8._0_8_ = (pointer)0x0;
            local_3d8._8_8_ = (pointer)0x0;
            pvVar18 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                    *)local_498._24_8_,sVar36);
            _Var6._M_head_impl =
                 (pvVar18->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pvVar18->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
              _Var7._M_nxt = *(_Hash_node_base **)local_3d8._0_8_;
              local_3d8._0_8_ = _Var6._M_head_impl;
              (*(code *)_Var7._M_nxt[1]._M_nxt)();
              _Var6._M_head_impl = (Expression *)local_3d8._0_8_;
            }
            local_3d8._0_8_ = _Var6._M_head_impl;
            pvVar19 = vector<duckdb::LogicalType,_true>::operator[]
                                ((vector<duckdb::LogicalType,_true> *)local_3f8._24_8_,sVar36);
            pvVar16 = vector<duckdb::ColumnBinding,_true>::operator[]
                                ((vector<duckdb::ColumnBinding,_true> *)local_168,sVar36);
            _Var26._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
                 operator_new(0x70);
            LogicalType::LogicalType((LogicalType *)local_298,pvVar19);
            binding_00.table_index = pvVar16->table_index;
            binding_00.column_index = pvVar16->column_index;
            BoundColumnRefExpression::BoundColumnRefExpression
                      ((BoundColumnRefExpression *)
                       _Var26._M_t.
                       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                       (LogicalType *)local_298,binding_00,0);
            LogicalType::~LogicalType((LogicalType *)local_298);
            local_498._0_8_ =
                 _Var26._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            pvVar19 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,sVar36);
            BoundCastExpression::AddDefaultCastToType
                      ((BoundCastExpression *)&local_548,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_498,pvVar19,false);
            uVar32 = local_3d8._8_8_;
            local_3d8._8_8_ = local_548._M_allocated_capacity;
            local_548._M_allocated_capacity = 0;
            if (((pointer)uVar32 != (pointer)0x0) &&
               ((*(code *)(*(__node_base_ptr *)uVar32)[1]._M_nxt)(),
               (long *)local_548._M_allocated_capacity != (long *)0x0)) {
              (**(code **)(*(long *)local_548._M_allocated_capacity + 8))();
            }
            local_548._M_allocated_capacity = 0;
            if ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_498._0_8_ !=
                (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
              (*(((Expression *)local_498._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_498._0_8_ =
                 (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
                  )0x0;
            local_3c8[0] = *(undefined1 *)
                            &local_5a8[0x12].
                             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            pLVar15 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                    *)local_4d8);
            ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
            emplace_back<duckdb::JoinCondition>
                      (&(pLVar15->conditions).
                        super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                       (JoinCondition *)local_3d8);
            if ((element_type *)local_3d8._8_8_ != (element_type *)0x0) {
              (**(code **)(*(long *)local_3d8._8_8_ + 8))();
            }
            local_3d8._8_8_ = (pointer)0x0;
            if ((ClientContext *)local_3d8._0_8_ != (ClientContext *)0x0) {
              (**(code **)(*(long *)local_3d8._0_8_ + 8))();
            }
            sVar36 = sVar36 + 1;
          } while (sVar36 < (ulong)((long)local_5a8[0x10].
                                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                          _M_head_impl -
                                    (long)local_5a8[0xf].
                                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                          _M_head_impl >> 3));
        }
        auVar9 = local_4d8;
        local_4d8 = (undefined1  [8])0x0;
        _Var3._M_head_impl =
             (local_550->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (local_550->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)auVar9;
        if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        puVar8 = local_5a8;
        (*(code *)(((local_5a8->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                  expressions).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_298,local_5a8);
        local_3d8._0_8_ = local_3f8._16_8_;
        local_3d8._8_8_ = (pointer)0x0;
        make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                  ((duckdb *)local_548._M_local_buf,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                   (LogicalType *)(puVar8 + 7),(ColumnBinding *)local_3d8);
        uVar32 = local_548._M_allocated_capacity;
        local_548._M_allocated_capacity = 0;
        if ((ClientContext *)local_298._0_8_ != (ClientContext *)local_288) {
          operator_delete((void *)local_298._0_8_);
        }
        uVar35 = local_168._0_8_;
        if (local_4d8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_4d8 + 8))();
          uVar35 = local_168._0_8_;
        }
        goto LAB_00d9ad62;
      }
      BoundLimitNode::ConstantValue((BoundLimitNode *)local_3d8,1);
      BoundLimitNode::BoundLimitNode((BoundLimitNode *)local_4d8);
      this_01._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )operator_new(0xa8);
      local_298._0_8_ = local_3d8._0_8_;
      local_298._8_8_ = local_3d8._8_8_;
      local_288._0_8_ = local_3c8._0_8_;
      local_288._8_8_ = local_3c8._8_8_;
      local_3c8._8_8_ = (_Hash_node_base *)0x0;
      local_168._0_8_ = local_4d8;
      local_168._8_8_ = pCStack_4d0;
      local_158._0_8_ = local_4c8[0]._M_allocated_capacity;
      local_158._8_8_ = local_4c8[0]._8_8_;
      local_4c8[0]._8_8_ =
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      LogicalLimit::LogicalLimit
                ((LogicalLimit *)
                 this_01._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 (BoundLimitNode *)local_298,(BoundLimitNode *)local_168);
      local_568 = (undefined1  [8])
                  this_01._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      if ((long *)local_158._8_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_158._8_8_ + 8))();
      }
      local_158._8_8_ = 0;
      if ((_Hash_node_base *)local_288._8_8_ != (_Hash_node_base *)0x0) {
        (*(code *)(*(_Hash_node_base **)local_288._8_8_)[1]._M_nxt)();
      }
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_4c8[0]._8_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_4c8[0]._8_8_ + 8))();
      }
      if ((_Hash_node_base *)local_3c8._8_8_ != (_Hash_node_base *)0x0) {
        (*(code *)(*(_Hash_node_base **)local_3c8._8_8_)[1]._M_nxt)();
      }
      this_02 = unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>::
                operator->((unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                            *)local_568);
      local_478.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_5b0._M_head_impl;
      local_5b0._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                (&this_02->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_478);
      if ((element_type *)
          local_478.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
        (**(code **)(*(long *)local_478.
                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8))();
      }
      auVar9 = local_568;
      _Var3._M_head_impl = local_5b0._M_head_impl;
      local_478.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_568 = (undefined1  [8])0x0;
      local_5b0._M_head_impl = (LogicalOperator *)auVar9;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      CountStarFun::GetFunction();
      FunctionBinder::FunctionBinder((FunctionBinder *)local_498,local_5a0);
      SimpleFunction::SimpleFunction((SimpleFunction *)local_168,(SimpleFunction *)local_298);
      local_168._0_8_ = &PTR__BaseScalarFunction_0243ff60;
      LogicalType::LogicalType((LogicalType *)(local_158 + 0x80),(LogicalType *)(local_238 + 0x30));
      local_158._152_4_ = local_200._16_4_;
      local_168._0_8_ = &PTR__AggregateFunction_02433f70;
      puVar33 = auStack_1e8;
      puVar34 = auStack_b8;
      for (lVar31 = 0xd; lVar31 != 0; lVar31 = lVar31 + -1) {
        *puVar34 = *puVar33;
        puVar33 = puVar33 + (ulong)bVar37 * -2 + 1;
        puVar34 = puVar34 + (ulong)bVar37 * -2 + 1;
      }
      auStack_b8[0xd]._0_1_ = (AggregateOrderDependent)local_1c0[0x40];
      auStack_b8[0xd]._1_1_ = (AggregateDistinctDependent)local_1c0[0x41];
      auStack_b8[0xe]._0_1_ = local_1c0[0x48];
      auStack_b8[0xe]._1_1_ = local_1c0[0x49];
      auStack_b8[0xe]._2_1_ = local_1c0[0x4a];
      auStack_b8[0xe]._3_1_ = local_1c0[0x4b];
      auStack_b8[0xe]._4_1_ = local_1c0[0x4c];
      auStack_b8[0xe]._5_1_ = local_1c0[0x4d];
      auStack_b8[0xe]._6_1_ = local_1c0[0x4e];
      auStack_b8[0xe]._7_1_ = local_1c0[0x4f];
      auStack_b8[0xf]._0_1_ = local_1c0[0x50];
      auStack_b8[0xf]._1_1_ = local_1c0[0x51];
      auStack_b8[0xf]._2_1_ = local_1c0[0x52];
      auStack_b8[0xf]._3_1_ = local_1c0[0x53];
      auStack_b8[0xf]._4_1_ = local_1c0[0x54];
      auStack_b8[0xf]._5_1_ = local_1c0[0x55];
      auStack_b8[0xf]._6_1_ = local_1c0[0x56];
      auStack_b8[0xf]._7_1_ = local_1c0[0x57];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._80_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_1c0._80_8_ + 8) = *(int *)(local_1c0._80_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_1c0._80_8_ + 8) = *(int *)(local_1c0._80_8_ + 8) + 1;
        }
      }
      local_528._M_allocated_capacity = 0;
      local_528._8_8_ = 0;
      local_518.
      super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
           (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
           (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)0x0;
      local_3f8._0_8_ = (_Hash_node_base *)0x0;
      FunctionBinder::BindAggregateFunction
                ((FunctionBinder *)&local_458,(AggregateFunction *)local_498,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_168,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_528._M_allocated_capacity,(AggregateType)local_3f8);
      if ((_Hash_node_base *)local_3f8._0_8_ != (_Hash_node_base *)0x0) {
        (*(code *)(*(_Hash_node_base **)local_3f8._0_8_)[1]._M_nxt)();
      }
      local_3f8._0_8_ = (_Hash_node_base *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_528);
      local_168._0_8_ = &PTR__AggregateFunction_02433f70;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_b8[0xf] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_b8[0xf]);
      }
      BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_168);
      pBVar27 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                              *)&local_458);
      LogicalType::LogicalType(&local_588,&(pBVar27->super_Expression).return_type);
      local_3d8._0_8_ =
           local_458.
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_548._M_allocated_capacity = 0;
      local_548._8_8_ = (__buckets_ptr)0x0;
      local_538.index = 0;
      local_458.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)local_548._M_local_buf,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_3d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_3d8._0_8_ + 8))();
      }
      pBVar11 = local_5a0;
      iVar28 = GenerateTableIndex(local_5a0);
      group_index = GenerateTableIndex(pBVar11);
      pBVar11 = (Binder *)operator_new(0xe0);
      local_3d8._0_8_ = local_548._M_allocated_capacity;
      local_3d8._8_8_ = local_548._8_8_;
      local_3c8._0_8_ = local_538.index;
      local_548._M_allocated_capacity = 0;
      local_548._8_8_ = 0;
      local_538.index = 0;
      LogicalAggregate::LogicalAggregate
                ((LogicalAggregate *)pBVar11,group_index,iVar28,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_3d8);
      local_4e0 = (undefined1  [8])pBVar11;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_3d8);
      pLVar29 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                              *)local_4e0);
      local_4e8._M_head_impl = local_5b0._M_head_impl;
      local_5b0._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                (&pLVar29->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_4e8);
      if ((LogicalLimit *)local_4e8._M_head_impl != (LogicalLimit *)0x0) {
        (*((LogicalOperator *)&(local_4e8._M_head_impl)->_vptr_LogicalOperator)->
          _vptr_LogicalOperator[1])();
      }
      auVar9 = local_4e0;
      _Var3._M_head_impl = local_5b0._M_head_impl;
      local_4e8._M_head_impl = (LogicalOperator *)0x0;
      local_4e0 = (undefined1  [8])0x0;
      local_5b0._M_head_impl = (LogicalOperator *)auVar9;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      pBVar20 = (BoundColumnRefExpression *)operator_new(0x70);
      LogicalType::LogicalType((LogicalType *)local_3d8,&local_588);
      binding_04.column_index = 0;
      binding_04.table_index = iVar28;
      BoundColumnRefExpression::BoundColumnRefExpression
                (pBVar20,(LogicalType *)local_3d8,binding_04,0);
      LogicalType::~LogicalType((LogicalType *)local_3d8);
      Value::Numeric((Value *)local_4d8,&local_588,1);
      pBVar11 = (Binder *)operator_new(0x98);
      Value::Value((Value *)local_3d8,(Value *)local_4d8);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)pBVar11,(Value *)local_3d8);
      Value::~Value((Value *)local_3d8);
      Value::~Value((Value *)local_4d8);
      this_04 = (BoundComparisonExpression *)operator_new(0x68);
      local_4d8 = (undefined1  [8])pBVar11;
      local_3d8._0_8_ = pBVar20;
      BoundComparisonExpression::BoundComparisonExpression
                (this_04,COMPARE_BOUNDARY_START,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_3d8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_4d8);
      if (local_4d8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_4d8 + 8))();
      }
      local_4d8 = (undefined1  [8])0x0;
      if ((BoundColumnRefExpression *)local_3d8._0_8_ != (BoundColumnRefExpression *)0x0) {
        (**(code **)(*(long *)local_3d8._0_8_ + 8))();
      }
      local_4d8 = (undefined1  [8])0x0;
      pCStack_4d0 = (ClientContext *)0x0;
      local_4c8[0]._M_allocated_capacity = (Binder *)0x0;
      local_3d8._0_8_ = this_04;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)local_4d8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_3d8);
      if ((BoundComparisonExpression *)local_3d8._0_8_ != (BoundComparisonExpression *)0x0) {
        (**(code **)(*(long *)local_3d8._0_8_ + 8))();
      }
      table_index = (pointer)GenerateTableIndex(local_5a0);
      this_05._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
            )operator_new(0x70);
      local_3d8._0_8_ = local_4d8;
      local_3d8._8_8_ = pCStack_4d0;
      local_3c8._0_8_ = local_4c8[0]._M_allocated_capacity;
      local_4d8 = (undefined1  [8])0x0;
      pCStack_4d0 = (ClientContext *)0x0;
      local_4c8[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      LogicalProjection::LogicalProjection
                ((LogicalProjection *)
                 this_05._M_t.
                 super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
                 .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl,
                 (idx_t)table_index,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_3d8);
      local_4f0._M_head_impl =
           (LogicalProjection *)
           this_05._M_t.
           super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
           .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_3d8);
      pLVar30 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                              *)&local_4f0);
      local_4f8._M_head_impl = local_5b0._M_head_impl;
      local_5b0._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                (&pLVar30->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_4f8);
      if ((LogicalAggregate *)local_4f8._M_head_impl != (LogicalAggregate *)0x0) {
        (*((LogicalOperator *)&(local_4f8._M_head_impl)->_vptr_LogicalOperator)->
          _vptr_LogicalOperator[1])();
      }
      local_598._M_head_impl = &(local_4f0._M_head_impl)->super_LogicalOperator;
      _Var3._M_head_impl = local_5b0._M_head_impl;
      local_4f8._M_head_impl = (LogicalOperator *)0x0;
      local_4f0._M_head_impl = (LogicalProjection *)0x0;
      local_5b0._M_head_impl = local_598._M_head_impl;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
        local_598._M_head_impl = local_5b0._M_head_impl;
      }
      puVar8 = local_550;
      local_500._M_head_impl =
           (local_550->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_550->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      local_5b0._M_head_impl = (LogicalOperator *)0x0;
      LogicalCrossProduct::Create
                ((LogicalCrossProduct *)local_3d8,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_500,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_598);
      uVar32 = local_3d8._0_8_;
      local_3d8._0_8_ = (pointer)0x0;
      _Var3._M_head_impl =
           (puVar8->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (puVar8->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)uVar32;
      if ((_Var3._M_head_impl != (LogicalOperator *)0x0) &&
         ((**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))(),
         (pointer)local_3d8._0_8_ != (pointer)0x0)) {
        (*(code *)(*(_Hash_node_base **)local_3d8._0_8_)[1]._M_nxt)();
      }
      local_3d8._0_8_ = (ClientContext *)0x0;
      if ((LogicalProjection *)local_598._M_head_impl != (LogicalProjection *)0x0) {
        (*((LogicalOperator *)&(local_598._M_head_impl)->_vptr_LogicalOperator)->
          _vptr_LogicalOperator[1])();
      }
      local_598._M_head_impl = (LogicalOperator *)0x0;
      if (local_500._M_head_impl != (LogicalOperator *)0x0) {
        (*(local_500._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      local_500._M_head_impl = (LogicalOperator *)0x0;
      (*(code *)(((local_5a8->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_3d8);
      local_438.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_438.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)table_index;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalTypeId_const&,duckdb::ColumnBinding>
                ((duckdb *)&local_508,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8,
                 &LogicalType::BOOLEAN,(ColumnBinding *)&local_438);
      uVar32 = local_508._M_head_impl;
      local_508._M_head_impl = (LogicalOperator *)0x0;
      if ((ClientContext *)local_3d8._0_8_ != (ClientContext *)local_3c8) {
        operator_delete((void *)local_3d8._0_8_);
      }
      if (local_4f0._M_head_impl != (LogicalProjection *)0x0) {
        (*((local_4f0._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_4d8);
      if (local_4e0 != (undefined1  [8])0x0) {
        (*((BaseExpression *)local_4e0)->_vptr_BaseExpression[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_548);
      LogicalType::~LogicalType(&local_588);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458.
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)
                      local_458.
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_298._0_8_ = &PTR__AggregateFunction_02433f70;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._80_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._80_8_);
      }
      BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_298);
      if (local_568 != (undefined1  [8])0x0) {
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_568)->_M_allocated_capacity + 8))();
      }
    }
    peVar23 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar32;
    if (peVar23 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar23->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
    }
    if (local_5b0._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_5b0._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_5b0._M_head_impl = (LogicalOperator *)0x0;
    goto LAB_00d9b357;
  }
  local_590._M_head_impl = (LogicalOperator *)uVar32;
  pBVar11 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  correlated_columns = &pBVar11->correlated_columns;
  bVar10 = true;
  if (*(char *)&local_5a8[0xe].
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl == '\x04') {
LAB_00d995c8:
    pCVar17 = (ClientContext *)GenerateTableIndex(local_5a0);
    local_548._M_allocated_capacity =
         (size_type)
         (local_550->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_550->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    CreateDuplicateEliminatedJoin
              ((duckdb *)&local_588,correlated_columns,MARK,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_548._M_allocated_capacity,bVar10);
    if ((LogicalOperator *)local_548._M_allocated_capacity != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_548._M_allocated_capacity + 8))();
    }
    local_548._M_allocated_capacity = 0;
    pLVar15 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
              ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                            *)&local_588);
    (pLVar15->super_LogicalJoin).mark_index = (idx_t)pCVar17;
    FlattenDependentJoins::FlattenDependentJoins
              ((FlattenDependentJoins *)local_298,local_5a0,correlated_columns,true,true);
    pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)&local_590);
    FlattenDependentJoins::DetectCorrelatedExpressions
              ((FlattenDependentJoins *)local_298,pLVar12,false,0);
    local_438.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_590._M_head_impl;
    local_590._M_head_impl = (LogicalOperator *)0x0;
    FlattenDependentJoins::PushDownDependentJoin
              ((FlattenDependentJoins *)local_498,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_298,SUB81(&local_438,0));
    if ((element_type *)
        local_438.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &(local_438.
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                  ->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_438.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_498);
    (*pLVar13->_vptr_LogicalOperator[2])(local_3d8,pLVar13);
    pLVar14 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
              ::operator*((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                           *)&local_588);
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
              ((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_4d8,
               (vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_3d8);
    CreateDelimJoinConditions
              (pLVar14,correlated_columns,(vector<duckdb::ColumnBinding,_true> *)local_4d8,
               local_288._8_8_,bVar10);
    if (local_4d8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_4d8);
    }
    _Var3._M_head_impl =
         local_5a8[0xf].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    _Var4._M_head_impl =
         local_5a8[0x10].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_3f8._16_8_ = pCVar17;
    if (8 < (ulong)((long)_Var4._M_head_impl - (long)_Var3._M_head_impl)) {
      this_06 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_168._0_8_ = local_158;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,"Correlated IN/ANY/ALL with multiple columns not yet supported"
                 ,"");
      NotImplementedException::NotImplementedException(this_06,(string *)local_168);
      __cxa_throw(this_06,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (_Var4._M_head_impl != _Var3._M_head_impl) {
      local_498._24_8_ = local_5a8 + 0xf;
      local_3f8._24_8_ = local_5a8 + 0x13;
      pvVar1 = (vector<duckdb::LogicalType,_true> *)(local_5a8 + 0x16);
      sVar36 = 0;
      do {
        local_528._M_allocated_capacity = 0;
        local_528._8_8_ = (long *)0x0;
        pvVar18 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                *)local_498._24_8_,sVar36);
        uVar32 = (pvVar18->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar18->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        if ((long *)local_528._M_allocated_capacity != (long *)0x0) {
          lVar31 = *(long *)local_528._M_allocated_capacity;
          local_528._M_allocated_capacity = uVar32;
          (**(code **)(lVar31 + 8))();
          uVar32 = local_528._M_allocated_capacity;
        }
        local_528._M_allocated_capacity = uVar32;
        pvVar19 = vector<duckdb::LogicalType,_true>::operator[]
                            ((vector<duckdb::LogicalType,_true> *)local_3f8._24_8_,sVar36);
        pvVar16 = vector<duckdb::ColumnBinding,_true>::operator[]
                            ((vector<duckdb::ColumnBinding,_true> *)local_3d8,sVar36);
        pBVar20 = (BoundColumnRefExpression *)operator_new(0x70);
        LogicalType::LogicalType((LogicalType *)local_168,pvVar19);
        binding.table_index = pvVar16->table_index;
        binding.column_index = pvVar16->column_index;
        BoundColumnRefExpression::BoundColumnRefExpression
                  (pBVar20,(LogicalType *)local_168,binding,0);
        LogicalType::~LogicalType((LogicalType *)local_168);
        local_478.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar20;
        pvVar19 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,sVar36);
        BoundCastExpression::AddDefaultCastToType
                  ((BoundCastExpression *)local_568,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_478,pvVar19,false);
        uVar32 = local_528._8_8_;
        local_528._8_8_ = local_568;
        local_568 = (undefined1  [8])0x0;
        if (((long *)uVar32 != (long *)0x0) &&
           ((**(code **)(*(long *)uVar32 + 8))(),
           (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            )local_568 != (LogicalOperator *)0x0)) {
          (**(code **)(*(_func_int **)local_568 + 8))();
        }
        local_568 = (undefined1  [8])0x0;
        if ((BoundColumnRefExpression *)
            local_478.
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (BoundColumnRefExpression *)0x0) {
          (**(code **)(*(long *)local_478.
                                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 8))();
        }
        local_478.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_518.
        super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
        .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl._0_1_ =
             *(undefined1 *)
              &local_5a8[0x12].
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        pLVar15 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_588);
        ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
        emplace_back<duckdb::JoinCondition>
                  (&(pLVar15->conditions).
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                   (JoinCondition *)&local_528);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*local_528._8_8_ + 8))();
        }
        local_528._8_8_ = 0;
        if ((ClientContext *)local_528._M_allocated_capacity != (ClientContext *)0x0) {
          (**(code **)(*(long *)local_528._M_allocated_capacity + 8))();
        }
        sVar36 = sVar36 + 1;
      } while (sVar36 < (ulong)((long)local_5a8[0x10].
                                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                      _M_head_impl -
                                (long)local_5a8[0xf].
                                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                      _M_head_impl >> 3));
    }
    pLVar15 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
              ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                            *)&local_588);
    uVar32 = local_3f8._16_8_;
    local_568 = (undefined1  [8])local_498._0_8_;
    local_498._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    LogicalOperator::AddChild
              ((LogicalOperator *)pLVar15,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_568);
    if (local_568 != (undefined1  [8])0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_568)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    uVar35 = local_588._0_8_;
    local_568 = (undefined1  [8])0x0;
    local_588._0_8_ = (ClientContext *)0x0;
    _Var3._M_head_impl =
         (local_550->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_550->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)uVar35;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    puVar8 = local_5a8;
    (*(code *)(((local_5a8->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->expressions)
              .
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_168,local_5a8);
    local_528._M_allocated_capacity = uVar32;
    local_528._8_8_ = 0;
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
              ((duckdb *)&local_458,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
               (LogicalType *)(puVar8 + 7),(ColumnBinding *)&local_528);
    _Var26._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
         (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
         local_458.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_458.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00d9ab57:
    if ((ClientContext *)local_168._0_8_ != (ClientContext *)local_158) {
      operator_delete((void *)local_168._0_8_);
    }
    if ((ClientContext *)local_3d8._0_8_ != (ClientContext *)0x0) {
      operator_delete((void *)local_3d8._0_8_);
    }
    if ((LogicalOperator *)local_498._0_8_ != (LogicalOperator *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_498._0_8_)->__weak_this_).
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(local_1c0);
    ::std::
    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_200);
    ::std::
    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_238);
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_288 + 0x18));
    uVar32 = local_588._0_8_;
  }
  else {
    bVar10 = PerformDuplicateElimination(local_5a0,correlated_columns);
    cVar2 = *(char *)&local_5a8[0xe].
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    if (cVar2 == '\x02') {
      pCVar17 = (ClientContext *)GenerateTableIndex(local_5a0);
      local_548._M_allocated_capacity =
           (size_type)
           (local_550->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_550->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      CreateDuplicateEliminatedJoin
                ((duckdb *)&local_588,correlated_columns,MARK,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_548._M_allocated_capacity,bVar10);
      if ((LogicalOperator *)local_548._M_allocated_capacity != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_548._M_allocated_capacity + 8))();
      }
      pLVar15 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_588);
      (pLVar15->super_LogicalJoin).mark_index = (idx_t)pCVar17;
      FlattenDependentJoins::FlattenDependentJoins
                ((FlattenDependentJoins *)local_298,local_5a0,correlated_columns,bVar10,true);
      pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)&local_590);
      FlattenDependentJoins::DetectCorrelatedExpressions
                ((FlattenDependentJoins *)local_298,pLVar12,false,0);
      local_438.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_590._M_head_impl;
      local_590._M_head_impl = (LogicalOperator *)0x0;
      FlattenDependentJoins::PushDownDependentJoin
                ((FlattenDependentJoins *)local_498,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_298,SUB81(&local_438,0));
      if ((element_type *)
          local_438.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                     &(local_438.
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     )->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      local_438.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)local_498);
      (*pLVar13->_vptr_LogicalOperator[2])(local_3d8,pLVar13);
      pLVar14 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator*((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                             *)&local_588);
      ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
                ((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_4d8,
                 (vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_3d8)
      ;
      CreateDelimJoinConditions
                (pLVar14,correlated_columns,(vector<duckdb::ColumnBinding,_true> *)local_4d8,
                 local_288._8_8_,bVar10);
      if (local_4d8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_4d8);
      }
      pLVar15 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_588);
      local_568 = (undefined1  [8])local_498._0_8_;
      local_498._0_8_ =
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )0x0;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar15,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_568);
      if (local_568 != (undefined1  [8])0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_568)->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      uVar32 = local_588._0_8_;
      local_568 = (undefined1  [8])0x0;
      local_588._0_8_ = (ClientContext *)0x0;
      _Var3._M_head_impl =
           (local_550->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_550->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)uVar32;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      puVar8 = local_5a8;
      (*(code *)(((local_5a8->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_168,local_5a8);
      local_528._8_8_ = 0;
      local_528._M_allocated_capacity = (size_type)pCVar17;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)&local_478,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 (LogicalType *)(puVar8 + 7),(ColumnBinding *)&local_528);
      _Var26._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
           (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
           local_478.
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_478.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      goto LAB_00d9ab57;
    }
    if (cVar2 != '\x01') goto LAB_00d995c8;
    local_588._0_8_ =
         (local_550->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_550->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    CreateDuplicateEliminatedJoin
              ((duckdb *)local_528._M_local_buf,correlated_columns,SINGLE,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_588,bVar10);
    if ((ClientContext *)local_588._0_8_ != (ClientContext *)0x0) {
      (*((BaseExpression *)local_588._0_8_)->_vptr_BaseExpression[1])();
    }
    FlattenDependentJoins::FlattenDependentJoins
              ((FlattenDependentJoins *)local_298,local_5a0,correlated_columns,bVar10,false);
    pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)&local_590);
    FlattenDependentJoins::DetectCorrelatedExpressions
              ((FlattenDependentJoins *)local_298,pLVar12,false,0);
    local_498._0_8_ = local_590._M_head_impl;
    local_590._M_head_impl = (LogicalOperator *)0x0;
    FlattenDependentJoins::PushDownDependentJoin
              ((FlattenDependentJoins *)&local_548,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_298,SUB81(local_498,0));
    if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
        local_498._0_8_ != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_498._0_8_ + 8))();
    }
    local_498._0_8_ =
         (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)0x0;
    pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)&local_548._M_allocated_capacity);
    (*pLVar13->_vptr_LogicalOperator[2])(local_3d8,pLVar13);
    pLVar14 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
              ::operator*((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                           *)&local_528._M_allocated_capacity);
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
              ((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_4d8,
               (vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_3d8);
    CreateDelimJoinConditions
              (pLVar14,correlated_columns,(vector<duckdb::ColumnBinding,_true> *)local_4d8,
               local_288._8_8_,bVar10);
    if (local_4d8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_4d8);
    }
    pLVar15 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
              ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                            *)&local_528._M_allocated_capacity);
    local_438.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_548._M_allocated_capacity;
    local_548._M_allocated_capacity = 0;
    LogicalOperator::AddChild
              ((LogicalOperator *)pLVar15,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_438);
    if ((element_type *)
        local_438.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
      (*(((Expression *)
         &(local_438.
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)->
        super_BaseExpression)._vptr_BaseExpression[1])();
    }
    uVar32 = local_528._M_allocated_capacity;
    local_438.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_528._M_allocated_capacity = 0;
    _Var3._M_head_impl =
         (local_550->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_550->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)uVar32;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    (*(code *)(((local_5a8->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->expressions)
              .
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_168);
    pvVar16 = vector<duckdb::ColumnBinding,_true>::operator[]
                        ((vector<duckdb::ColumnBinding,_true> *)local_3d8,local_288._16_8_);
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&>
              ((duckdb *)local_568,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
               (LogicalType *)(local_5a8 + 7),pvVar16);
    _Var26._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
         (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)local_568;
    local_568 = (undefined1  [8])0x0;
    if ((ClientContext *)local_168._0_8_ != (ClientContext *)local_158) {
      operator_delete((void *)local_168._0_8_);
    }
    if ((ClientContext *)local_3d8._0_8_ != (ClientContext *)0x0) {
      operator_delete((void *)local_3d8._0_8_);
    }
    if ((LogicalOperator *)local_548._M_allocated_capacity != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_548._M_allocated_capacity + 8))();
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(local_1c0);
    ::std::
    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_200);
    ::std::
    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_238);
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_288 + 0x18));
    uVar32 = local_528._M_allocated_capacity;
  }
  if ((ClientContext *)uVar32 != (ClientContext *)0x0) {
    (*((BaseExpression *)
      &((ClientContext *)uVar32)->super_enable_shared_from_this<duckdb::ClientContext>)->
      _vptr_BaseExpression[1])();
  }
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       _Var26._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (local_590._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_590._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_590._M_head_impl = (LogicalOperator *)0x0;
LAB_00d9b357:
  pBVar11 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_2a8);
  if (pBVar11->has_unplanned_dependent_joins == true) {
    local_298._0_8_ = &PTR__RecursiveDependentJoinPlanner_024362b0;
    local_298._8_8_ = (pointer)0x0;
    local_288._0_8_ = local_5a0;
    pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*(local_550);
    RecursiveDependentJoinPlanner::VisitOperator((RecursiveDependentJoinPlanner *)local_298,pLVar12)
    ;
    local_298._0_8_ = &PTR__RecursiveDependentJoinPlanner_024362b0;
    if ((pointer)local_298._8_8_ != (pointer)0x0) {
      (*(code *)(*(__node_base_ptr *)local_298._8_8_)[1]._M_nxt)();
    }
  }
  if ((element_type *)local_420._0_8_ != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_420._0_8_)->__weak_this_).
                internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> Binder::PlanSubquery(BoundSubqueryExpression &expr, unique_ptr<LogicalOperator> &root) {
	D_ASSERT(root);
	// first we translate the QueryNode of the subquery into a logical plan
	// note that we do not plan nested subqueries yet
	auto sub_binder = Binder::CreateBinder(context, this);
	sub_binder->is_outside_flattened = false;
	auto subquery_root = sub_binder->CreatePlan(*expr.subquery);
	D_ASSERT(subquery_root);

	// now we actually flatten the subquery
	auto plan = std::move(subquery_root);

	unique_ptr<Expression> result_expression;
	if (!expr.IsCorrelated()) {
		result_expression = PlanUncorrelatedSubquery(*this, expr, root, std::move(plan));
	} else {
		result_expression = PlanCorrelatedSubquery(*this, expr, root, std::move(plan));
	}
	// finally, we recursively plan the nested subqueries (if there are any)
	if (sub_binder->has_unplanned_dependent_joins) {
		RecursiveDependentJoinPlanner plan(*this);
		plan.VisitOperator(*root);
	}
	return result_expression;
}